

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsecpp.cpp
# Opt level: O1

int non_whitespace(QString *content,int pos)

{
  char16_t cVar1;
  long lVar2;
  int i;
  long lVar3;
  
  lVar2 = (content->d).size;
  lVar3 = (long)pos;
  if (lVar3 < lVar2) {
    do {
      cVar1 = (content->d).ptr[lVar3];
      if (((ushort)cVar1 < 0x21 & (byte)(0x100002600 >> ((byte)cVar1 & 0x3f))) == 0) {
        return (int)lVar3;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < lVar2);
  }
  return -1;
}

Assistant:

int non_whitespace(const QString& content, int pos) {
    for(int i=pos;i<content.size();i++) {
        bool ws = content[i] == ' '
                || content[i] == '\t'
                || content[i] == '\r'
                || content[i] == '\n';
        if (!ws) {
            return i;
        }
    }
    return -1;
}